

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

bool __thiscall QMarkdownTextEdit::handleReturnEntered(QMarkdownTextEdit *this)

{
  Data *pDVar1;
  QRegularExpression QVar2;
  char cVar3;
  MoveMode MVar4;
  uint uVar5;
  uint uVar6;
  QRegularExpressionMatch *this_00;
  bool bVar7;
  QRegularExpressionMatchIterator iterator;
  QTextCursor cursor;
  QString whitespaces;
  QRegularExpressionMatch match_1;
  QString listCharacter;
  QRegularExpression regex;
  QString realListCharacter;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QString whitespaceCharacter;
  QString currentLine;
  QRegularExpressionMatch match;
  QString currentLineText;
  QArrayDataPointer<char16_t> local_38;
  
  cVar3 = QPlainTextEdit::isReadOnly();
  if (cVar3 != '\0') {
    return true;
  }
  QPlainTextEdit::textCursor();
  MVar4 = QTextCursor::position();
  QTextCursor::movePosition((MoveOperation)&cursor,4,1);
  QTextCursor::selectedText();
  QString::QString(&currentLine,"^(\\s*)([+|\\-|\\*] \\[(x| |)\\]|[+\\-\\*])(\\s+)$");
  QRegularExpression::QRegularExpression(&regex,&currentLine,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&currentLine.d);
  QRegularExpression::globalMatch(&iterator,&regex,&currentLineText,0,0,0);
  cVar3 = QRegularExpressionMatchIterator::hasNext();
  if (cVar3 == '\0') {
    QString::QString(&currentLine,"^(\\s*)(\\d+[\\.|\\)])(\\s+)$");
    QRegularExpression::QRegularExpression((QRegularExpression *)&whitespaces,&currentLine,0);
    QVar2 = regex;
    regex.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)whitespaces.d.d;
    whitespaces.d.d = (Data *)QVar2.d.d;
    QRegularExpression::~QRegularExpression((QRegularExpression *)&whitespaces);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&currentLine.d);
    QRegularExpression::globalMatch(&currentLine,&regex,&currentLineText,0,0,0);
    pDVar1 = (Data *)CONCAT44(currentLine.d.d._4_4_,currentLine.d.d._0_4_);
    currentLine.d.d._0_4_ = SUB84(_iterator,0);
    currentLine.d.d._4_4_ = (undefined4)((ulong)_iterator >> 0x20);
    _iterator = pDVar1;
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&currentLine);
    cVar3 = QRegularExpressionMatchIterator::hasNext();
    if (cVar3 == '\0') {
      QString::trimmed_helper((QString *)&currentLine);
      if (CONCAT44(currentLine.d.size._4_4_,(undefined4)currentLine.d.size) < 1) {
LAB_001120e2:
        QString::QString(&whitespaces,"^(\\s*)(\\d+)([\\.|\\)])(\\s+)");
        QRegularExpression::QRegularExpression((QRegularExpression *)&listCharacter,&whitespaces,0);
        QVar2 = regex;
        regex.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                    (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)listCharacter.d.d;
        listCharacter.d.d = (Data *)QVar2.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&listCharacter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
        QRegularExpression::globalMatch(&whitespaces,&regex,&currentLineText,0,0,0);
        pDVar1 = _iterator;
        _iterator = whitespaces.d.d;
        whitespaces.d.d = pDVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&whitespaces);
        cVar3 = QRegularExpressionMatchIterator::hasNext();
        if (cVar3 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&whitespaces);
          QRegularExpressionMatch::captured((int)&listCharacter);
          uVar5 = QString::toUInt(&listCharacter,(bool *)0x0,10);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&listCharacter.d);
          QRegularExpressionMatch::captured((int)&listCharacter);
          QRegularExpressionMatch::captured((int)&whitespaceCharacter);
          QTextCursor::setPosition((int)&cursor,MVar4);
          operator+((QString *)&local_38,"\n",&whitespaces);
          QString::number((uint)&match,uVar5 + 1);
          operator+((QString *)&local_d0,(QString *)&local_38,(QString *)&match);
          operator+((QString *)&local_b8,(QString *)&local_d0,&listCharacter);
          operator+(&realListCharacter,(QString *)&local_b8,&whitespaceCharacter);
          QTextCursor::insertText((QString *)&cursor);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&realListCharacter.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
          QPlainTextEdit::ensureCursorVisible();
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaceCharacter.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&listCharacter.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
          this_00 = &match_1;
          goto LAB_001123f1;
        }
        QString::QString(&whitespaces,"^(\\s+)");
        QRegularExpression::QRegularExpression((QRegularExpression *)&listCharacter,&whitespaces,0);
        QVar2 = regex;
        regex.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                    (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)listCharacter.d.d;
        listCharacter.d.d = (Data *)QVar2.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&listCharacter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
        QRegularExpression::globalMatch(&whitespaces,&regex,&currentLineText,0,0,0);
        pDVar1 = _iterator;
        _iterator = whitespaces.d.d;
        whitespaces.d.d = pDVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&whitespaces);
        cVar3 = QRegularExpressionMatchIterator::hasNext();
        if (cVar3 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&whitespaces);
          QTextCursor::setPosition((int)&cursor,MVar4);
          operator+(&listCharacter,"\n",&whitespaces);
          QTextCursor::insertText((QString *)&cursor);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&listCharacter.d);
          QPlainTextEdit::ensureCursorVisible();
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
          this_00 = (QRegularExpressionMatch *)&whitespaceCharacter;
          goto LAB_001123f1;
        }
        bVar7 = false;
      }
      else {
        if (CONCAT44(currentLine.d.size._4_4_,(undefined4)currentLine.d.size) == 1) {
          bVar7 = false;
        }
        else {
          bVar7 = ((ushort *)CONCAT44(currentLine.d.ptr._4_4_,currentLine.d.ptr._0_4_))[1] == 0x20;
        }
        uVar6 = (uint)*(ushort *)CONCAT44(currentLine.d.ptr._4_4_,currentLine.d.ptr._0_4_);
        if (((0x2d < uVar6) || ((0x2c0000000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) || (!bVar7))
        goto LAB_001120e2;
        QString::QString(&whitespaces,"^(\\s*)([+|\\-|\\*] \\[(x| |)\\]|[+\\-\\*])(\\s+)");
        QRegularExpression::QRegularExpression((QRegularExpression *)&listCharacter,&whitespaces,0);
        QVar2 = regex;
        regex.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                    (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)listCharacter.d.d;
        listCharacter.d.d = (Data *)QVar2.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&listCharacter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
        QRegularExpression::globalMatch(&whitespaces,&regex,&currentLineText,0,0,0);
        pDVar1 = _iterator;
        _iterator = whitespaces.d.d;
        whitespaces.d.d = pDVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&whitespaces);
        cVar3 = QRegularExpressionMatchIterator::hasNext();
        if (cVar3 == '\0') goto LAB_001120e2;
        QRegularExpressionMatchIterator::next();
        QRegularExpressionMatch::captured((int)&whitespaces);
        QRegularExpressionMatch::captured((int)&listCharacter);
        QRegularExpressionMatch::captured((int)&whitespaceCharacter);
        QString::QString(&realListCharacter,"^([+|\\-|\\*]) \\[(x| |)\\]");
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_d0,&realListCharacter,0)
        ;
        QRegularExpression::globalMatch(&local_b8,&local_d0,&listCharacter,0,0,0);
        pDVar1 = _iterator;
        _iterator = local_b8.d;
        local_b8.d = pDVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_b8);
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&realListCharacter.d);
        cVar3 = QRegularExpressionMatchIterator::hasNext();
        if (cVar3 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&realListCharacter);
          local_d0.d = (Data *)0x0;
          local_d0.ptr = L" [ ]";
          local_d0.size = 4;
          local_38.d = (Data *)0x0;
          local_38.ptr = (char16_t *)0x0;
          local_38.size = 0;
          operator+((QString *)&local_b8,&realListCharacter,(QString *)&local_d0);
          QString::operator=(&listCharacter,(QString *)&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&realListCharacter.d);
          QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
        }
        QTextCursor::setPosition((int)&cursor,MVar4);
        operator+((QString *)&local_d0,"\n",&whitespaces);
        operator+((QString *)&local_b8,(QString *)&local_d0,&listCharacter);
        operator+(&realListCharacter,(QString *)&local_b8,&whitespaceCharacter);
        QTextCursor::insertText((QString *)&cursor);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&realListCharacter.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
        QPlainTextEdit::ensureCursorVisible();
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaceCharacter.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&listCharacter.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
        this_00 = &match;
LAB_001123f1:
        QRegularExpressionMatch::~QRegularExpressionMatch(this_00);
        bVar7 = true;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&currentLine.d);
      goto LAB_0011240a;
    }
    currentLine.d.d._0_4_ = 2;
    currentLine.d.size._4_4_ = 0;
    currentLine.d.d._4_4_ = 0;
    currentLine.d.ptr._0_4_ = 0;
    currentLine.d.ptr._4_4_ = 0;
    currentLine.d.size._0_4_ = 0;
    QMessageLogger::debug();
    QTextCursor::selectedText();
    QDebug::operator<<((QDebug *)&listCharacter,&whitespaces);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&whitespaces.d);
    QDebug::~QDebug((QDebug *)&listCharacter);
  }
  bVar7 = true;
  QTextCursor::removeSelectedText();
LAB_0011240a:
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&iterator);
  QRegularExpression::~QRegularExpression(&regex);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&currentLineText.d);
  QTextCursor::~QTextCursor(&cursor);
  return bVar7;
}

Assistant:

bool QMarkdownTextEdit::handleReturnEntered() {
    if (isReadOnly()) {
        return true;
    }

    QTextCursor cursor = this->textCursor();
    const int position = cursor.position();

    cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::KeepAnchor);
    const QString currentLineText = cursor.selectedText();

    // if return is pressed and there is just an unordered list symbol then we
    // want to remove the list symbol Valid listCharacters: '+ ', '-' , '* ', '+
    // [ ] ', '+ [x] ', '- [ ] ', '- [x] ', '* [ ] ', '* [x] '.
    QRegularExpression regex(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+)$)");
    QRegularExpressionMatchIterator iterator =
        regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        cursor.removeSelectedText();
        return true;
    }

    // if return is pressed and there is just an ordered list symbol then we
    // want to remove the list symbol
    regex = QRegularExpression(R"(^(\s*)(\d+[\.|\)])(\s+)$)");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        qDebug() << cursor.selectedText();
        cursor.removeSelectedText();
        return true;
    }

    // Check if we are in an unordered list.
    // We are in a list when we have '* ', '- ' or '+ ', possibly with preceding
    // whitespace. If e.g. user has entered '**text**' and pressed enter - we
    // don't want do anymore list-stuff.
    QString currentLine = currentLineText.trimmed();
    QChar char0;
    QChar char1;
    if (currentLine.length() >= 1)
        char0 = currentLine.at(0);
    if (currentLine.length() >= 2)
        char1 = currentLine.at(1);
    const bool inList =
        ((char0 == QLatin1Char('*') || char0 == QLatin1Char('-') ||
          char0 == QLatin1Char('+')) &&
         char1 == QLatin1Char(' '));

    if (inList) {
        // if the current line starts with a list character (possibly after
        // whitespaces) add the whitespaces at the next line too
        // Valid listCharacters: '+ ', '-' , '* ', '+ [ ] ', '+ [x] ', '- [ ] ',
        // '- [x] ', '* [ ] ', '* [x] '.
        regex =
            QRegularExpression(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+))");
        iterator = regex.globalMatch(currentLineText);
        if (iterator.hasNext()) {
            const QRegularExpressionMatch match = iterator.next();
            const QString whitespaces = match.captured(1);
            QString listCharacter = match.captured(2);
            const QString whitespaceCharacter = match.captured(4);

            // start new checkbox list item with an unchecked checkbox
            iterator = QRegularExpression(R"(^([+|\-|\*]) \[(x| |)\])")
                           .globalMatch(listCharacter);
            if (iterator.hasNext()) {
                const QRegularExpressionMatch match = iterator.next();
                const QString realListCharacter = match.captured(1);
                listCharacter = realListCharacter + QStringLiteral(" [ ]");
            }

            cursor.setPosition(position);
            cursor.insertText("\n" + whitespaces + listCharacter +
                              whitespaceCharacter);

            // scroll to the cursor if we are at the bottom of the document
            ensureCursorVisible();
            return true;
        }
    }

    // check for ordered lists and increment the list number in the next line
    regex = QRegularExpression(R"(^(\s*)(\d+)([\.|\)])(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);
        const uint listNumber = match.captured(2).toUInt();
        const QString listMarker = match.captured(3);
        const QString whitespaceCharacter = match.captured(4);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces + QString::number(listNumber + 1) +
                          listMarker + whitespaceCharacter);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    // intent next line with same whitespaces as in current line
    regex = QRegularExpression(R"(^(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    return false;
}